

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

complex<float> __thiscall
TPZFYsmpMatrix<std::complex<float>_>::GetVal
          (TPZFYsmpMatrix<std::complex<float>_> *this,int64_t row,int64_t col)

{
  long *plVar1;
  long lVar2;
  complex<float> cVar3;
  
  plVar1 = (this->fIA).fStore;
  cVar3._M_value = plVar1[row];
  while( true ) {
    if (plVar1[row + 1] <= (long)cVar3._M_value) {
      return (complex<float>)cVar3._M_value;
    }
    lVar2 = (this->fJA).fStore[cVar3._M_value];
    if (lVar2 != -1 && lVar2 == col) break;
    cVar3._M_value = cVar3._M_value + 1;
  }
  return (complex<float>)cVar3._M_value;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}